

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlock.c
# Opt level: O0

int Run(void *data)

{
  FILE *pFVar1;
  Uint32 UVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  void *data_local;
  
  UVar2 = SDL_ThreadID();
  if (UVar2 == mainthread) {
    signal(0xf,closemutex);
  }
  while( true ) {
    uVar3 = SDL_ThreadID();
    printf("Process %u ready to work\n",(ulong)uVar3);
    iVar4 = SDL_mutexP(mutex);
    pFVar1 = _stderr;
    if (iVar4 < 0) {
      uVar5 = SDL_GetError();
      fprintf(pFVar1,"Couldn\'t lock mutex: %s",uVar5);
      exit(1);
    }
    uVar3 = SDL_ThreadID();
    printf("Process %u, working!\n",(ulong)uVar3);
    SDL_Delay(1000);
    uVar3 = SDL_ThreadID();
    printf("Process %u, done!\n",(ulong)uVar3);
    iVar4 = SDL_mutexV(mutex);
    pFVar1 = _stderr;
    if (iVar4 < 0) break;
    SDL_Delay(10);
    UVar2 = SDL_ThreadID();
    if ((UVar2 == mainthread) && (doterminate != 0)) {
      uVar3 = SDL_ThreadID();
      printf("Process %u:  raising SIGTERM\n",(ulong)uVar3);
      raise(0xf);
    }
  }
  uVar5 = SDL_GetError();
  fprintf(pFVar1,"Couldn\'t unlock mutex: %s",uVar5);
  exit(1);
}

Assistant:

int SDLCALL Run(void *data)
{
	if ( SDL_ThreadID() == mainthread )
		signal(SIGTERM, closemutex);
	while ( 1 ) {
		printf("Process %u ready to work\n", SDL_ThreadID());
		if ( SDL_mutexP(mutex) < 0 ) {
			fprintf(stderr, "Couldn't lock mutex: %s", SDL_GetError());
			exit(1);
		}
		printf("Process %u, working!\n", SDL_ThreadID());
		SDL_Delay(1*1000);
		printf("Process %u, done!\n", SDL_ThreadID());
		if ( SDL_mutexV(mutex) < 0 ) {
			fprintf(stderr, "Couldn't unlock mutex: %s", SDL_GetError());
			exit(1);
		}
		/* If this sleep isn't done, then threads may starve */
		SDL_Delay(10);
		if (SDL_ThreadID() == mainthread && doterminate) {
			printf("Process %u:  raising SIGTERM\n", SDL_ThreadID());
			raise(SIGTERM);
		}
	}
	return(0);
}